

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O3

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  curl_slist *headers;
  undefined8 uVar3;
  CURLM *cm;
  char buffer [246];
  undefined1 auStack_128 [256];
  
  eh[0] = (CURL *)0x0;
  eh[1] = (CURL *)0x0;
  tv_test_start = tutil_tvnow();
  iVar2 = 99;
  if (3 < test_argc) {
    curl_msnprintf(auStack_128,0xf6,"Host: %s",test_argv[4]);
    headers = (curl_slist *)curl_slist_append(0,auStack_128);
    if (headers == (curl_slist *)0x0) {
      curl_mfprintf(_stderr,"curl_slist_append() failed\n");
      iVar2 = 0x7e;
    }
    else {
      iVar2 = curl_global_init();
      uVar1 = _stderr;
      if (iVar2 == 0) {
        cm = (CURLM *)curl_multi_init();
        if (cm == (CURLM *)0x0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                        ,0xd8);
          curl_global_cleanup();
          curl_slist_free_all(headers);
          iVar2 = 0x7b;
          goto LAB_00101452;
        }
        iVar2 = loop(0,cm,URL,libtest_arg3,headers);
        if (iVar2 == 0) {
          curl_mfprintf(_stderr,"lib540: now we do the request again\n");
          iVar2 = loop(1,cm,URL,libtest_arg3,headers);
        }
        curl_multi_remove_handle(cm,eh[0]);
        curl_easy_cleanup(eh[0]);
        curl_multi_remove_handle(cm,eh[1]);
        curl_easy_cleanup(eh[1]);
        curl_multi_cleanup(cm);
        curl_global_cleanup();
      }
      else {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                      ,0xd2,iVar2,uVar3);
      }
      curl_slist_free_all(headers);
    }
  }
LAB_00101452:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLM *cm = NULL;
  struct curl_slist *headers = NULL;
  char buffer[246]; /* naively fixed-size */
  int res = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    eh[i] = NULL;

  start_test_timing();

  if(test_argc < 4)
    return 99;

  msnprintf(buffer, sizeof(buffer), "Host: %s", HOST);

  /* now add a custom Host: header */
  headers = curl_slist_append(headers, buffer);
  if(!headers) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(headers);
    return res;
  }

  res_multi_init(cm);
  if(res) {
    curl_global_cleanup();
    curl_slist_free_all(headers);
    return res;
  }

  res = loop(0, cm, URL, PROXYUSERPWD, headers);
  if(res)
    goto test_cleanup;

  fprintf(stderr, "lib540: now we do the request again\n");

  res = loop(1, cm, URL, PROXYUSERPWD, headers);

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(cm, eh[i]);
    curl_easy_cleanup(eh[i]);
  }

  curl_multi_cleanup(cm);
  curl_global_cleanup();

  curl_slist_free_all(headers);

  return res;
}